

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quadrule.cpp
# Opt level: O0

void hermite_ss_compute(int order,double *xtab,double *weight)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double local_58;
  double x;
  double s;
  double r8_pi;
  double p1;
  double dStack_30;
  int i;
  double dp2;
  double cc;
  double *weight_local;
  double *xtab_local;
  int order_local;
  
  s = 3.141592653589793;
  cc = (double)weight;
  weight_local = xtab;
  xtab_local._4_4_ = order;
  dVar1 = sqrt(3.141592653589793);
  dVar2 = tgamma((double)xtab_local._4_4_);
  dVar3 = pow(2.0,(double)(xtab_local._4_4_ + -1));
  dp2 = (dVar1 * dVar2) / dVar3;
  x = pow((double)xtab_local._4_4_ + (double)xtab_local._4_4_ + 1.0,0.16666666666666666);
  for (p1._4_4_ = 0; dVar1 = local_58, p1._4_4_ < (xtab_local._4_4_ + 1) / 2;
      p1._4_4_ = p1._4_4_ + 1) {
    if (p1._4_4_ == 0) {
      local_58 = x * x * x + -(1.85575 / x);
    }
    else if (p1._4_4_ == 1) {
      dVar2 = pow((double)xtab_local._4_4_,0.426);
      local_58 = dVar1 - (dVar2 * 1.14) / local_58;
    }
    else if (p1._4_4_ == 2) {
      local_58 = local_58 * 1.86 + -(*weight_local * 0.86);
    }
    else if (p1._4_4_ == 3) {
      local_58 = local_58 * 1.91 + -(weight_local[1] * 0.91);
    }
    else {
      local_58 = local_58 + local_58 + -weight_local[p1._4_4_ + -2];
    }
    hermite_ss_root(&local_58,xtab_local._4_4_,&stack0xffffffffffffffd0,&r8_pi);
    weight_local[p1._4_4_] = local_58;
    *(double *)((long)cc + (long)p1._4_4_ * 8) = (dp2 / dStack_30) / r8_pi;
    weight_local[(xtab_local._4_4_ - p1._4_4_) + -1] = -local_58;
    *(undefined8 *)((long)cc + (long)((xtab_local._4_4_ - p1._4_4_) + -1) * 8) =
         *(undefined8 *)((long)cc + (long)p1._4_4_ * 8);
  }
  for (p1._4_4_ = 0; p1._4_4_ < xtab_local._4_4_ / 2; p1._4_4_ = p1._4_4_ + 1) {
    dVar1 = weight_local[p1._4_4_];
    weight_local[p1._4_4_] = weight_local[(xtab_local._4_4_ + -1) - p1._4_4_];
    weight_local[(xtab_local._4_4_ + -1) - p1._4_4_] = dVar1;
  }
  return;
}

Assistant:

void hermite_ss_compute ( int order, double xtab[], double weight[] )

//****************************************************************************80
//
//  Purpose:
//
//    HERMITE_SS_COMPUTE computes a Gauss-Hermite quadrature rule.
//
//  Discussion:
//
//    The abscissas are the zeros of the N-th order Hermite polynomial.
//
//    The integral:
//
//      Integral ( -oo < X < +oo ) exp ( - X*X ) * F(X) dX
//
//    The quadrature rule:
//
//      Sum ( 1 <= I <= ORDER ) WEIGHT(I) * F ( XTAB(I) )
//
//  Licensing:
//
//    This code is distributed under the GNU LGPL license. 
//
//  Modified:
//
//    19 April 2011
//
//  Author:
//
//    Original FORTRAN77 version by Arthur Stroud, Don Secrest.
//    C++ version by John Burkardt.
//
//  Reference:
//
//    Arthur Stroud, Don Secrest,
//    Gaussian Quadrature Formulas,
//    Prentice Hall, 1966,
//    LC: QA299.4G3S7.
//
//  Parameters:
//
//    Input, int ORDER, the order of the formula to be computed.
//
//    Output, double XTAB[ORDER], the abscissas.
//
//    Output, double WEIGHT[ORDER], the weights.
//
{
  double cc;
  double dp2;
  int i;
  double p1;
  const double r8_pi = 3.141592653589793;
  double s;
  double x;

  cc = sqrt ( r8_pi ) * tgamma ( double( order ) ) 
    / pow ( 2.0, order - 1 );

  s = pow ( 2.0 * double( order ) + 1.0, 1.0 / 6.0 );

  for ( i = 0; i < ( order + 1 ) / 2; i++ )
  {
    if ( i == 0 )
    {
      x = s * s * s - 1.85575 / s;
    }
    else if ( i == 1 )
    {
      x = x - 1.14 * pow ( double( order ), 0.426 ) / x;
    }
    else if ( i == 2 )
    {
      x = 1.86 * x - 0.86 * xtab[0];
    }
    else if ( i == 3 )
    {
      x = 1.91 * x - 0.91 * xtab[1];
    }
    else
    {
      x = 2.0 * x - xtab[i-2];
    }

    hermite_ss_root ( &x, order, &dp2, &p1 );

    xtab[i] = x;
    weight[i] = ( cc / dp2 ) / p1;

    xtab[order-i-1] = -x;
    weight[order-i-1] = weight[i];
  }
//
//  Reverse the order of the values.
//
  for ( i = 0; i < ( order / 2 ); i++ )
  {
    x               = xtab[i];
    xtab[i]         = xtab[order-1-i];
    xtab[order-1-i] = x;
  }

  return;
}